

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoundationPileTests.cpp
# Opt level: O1

void __thiscall
solitaire::piles::EmptyFoundationPileTest_tryAddAce_Test::EmptyFoundationPileTest_tryAddAce_Test
          (EmptyFoundationPileTest_tryAddAce_Test *this)

{
  undefined1 local_11;
  
  testing::Test::Test((Test *)this);
  (this->super_EmptyFoundationPileTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EmptyFoundationPileTest_00330fe0;
  std::__shared_ptr<solitaire::piles::FoundationPile,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<solitaire::piles::FoundationPile>>
            ((__shared_ptr<solitaire::piles::FoundationPile,(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_EmptyFoundationPileTest).pile,
             (allocator<solitaire::piles::FoundationPile> *)&local_11);
  (this->super_EmptyFoundationPileTest).super_Test._vptr_Test =
       (_func_int **)&PTR__EmptyFoundationPileTest_00330b50;
  return;
}

Assistant:

TEST_F(EmptyFoundationPileTest, tryAddAce) {
    const Cards pileCards {
        Card {Value::Ace, Suit::Heart}
    };

    std::optional<Card> cardToAdd = pileCards.front();

    pile->tryAddCard(cardToAdd);

    EXPECT_EQ(cardToAdd, std::nullopt);
    EXPECT_THAT(pile->getCards(), ContainerEq(pileCards));
    EXPECT_EQ(pile->getTopCardValue(), Value::Ace);
}